

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure.h
# Opt level: O3

array<unsigned_char,_32UL> * __thiscall
secure_allocator<std::array<unsigned_char,_32UL>_>::allocate
          (secure_allocator<std::array<unsigned_char,_32UL>_> *this,size_t n)

{
  long lVar1;
  array<unsigned_char,_32UL> *paVar2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::call_once<void(&)()>
            ((once_flag *)&LockedPoolManager::Instance()::init_flag,
             LockedPoolManager::CreateInstance);
  paVar2 = (array<unsigned_char,_32UL> *)
           LockedPool::alloc(&LockedPoolManager::_instance->super_LockedPool,n << 5);
  if (paVar2 == (array<unsigned_char,_32UL> *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = std::thread::_M_start_thread;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return paVar2;
  }
  __stack_chk_fail();
}

Assistant:

T* allocate(std::size_t n)
    {
        T* allocation = static_cast<T*>(LockedPoolManager::Instance().alloc(sizeof(T) * n));
        if (!allocation) {
            throw std::bad_alloc();
        }
        return allocation;
    }